

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

NetType_conflict __thiscall cfd::core::AddressFormatData::GetNetType(AddressFormatData *this)

{
  bool bVar1;
  NetType_conflict local_68;
  NetType_conflict result;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  string net_type;
  AddressFormatData *this_local;
  
  net_type.field_2._8_8_ = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_50,"nettype",&local_51);
  GetString((string *)local_30,this,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_68 = kCfdConnectionError;
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"mainnet");
  if (bVar1) {
    local_68 = kCfdSuccess;
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"testnet");
    if (bVar1) {
      local_68 = kCfdIllegalArgumentError;
    }
    else {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"regtest");
      if (bVar1) {
        local_68 = kCfdIllegalStateError;
      }
      else {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_30,"liquidv1");
        if (bVar1) {
          local_68 = kCfdOutOfRangeError;
        }
        else {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_30,"elementsregtest");
          if (bVar1) {
            local_68 = kCfdInvalidSettingError;
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)local_30);
  return local_68;
}

Assistant:

NetType AddressFormatData::GetNetType() const {
  std::string net_type = GetString(kNettype);
  NetType result = NetType::kCustomChain;
  if (net_type == kNettypeMainnet) {
    result = NetType::kMainnet;
  } else if (net_type == kNettypeTestnet) {
    result = NetType::kTestnet;
  } else if (net_type == kNettypeRegtest) {
    result = NetType::kRegtest;
  } else {
#ifndef CFD_DISABLE_ELEMENTS
    if (net_type == kNettypeLiquidV1) {
      result = NetType::kLiquidV1;
    } else if (net_type == kNettypeElementsRegtest) {
      result = NetType::kElementsRegtest;
    }
#endif  // CFD_DISABLE_ELEMENTS
  }
  return result;
}